

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O0

Gia_Man_t *
Gia_ManPerformSopBalanceWin
          (Gia_Man_t *p,int LevelMax,int nTimeWindow,int nCutNum,int nRelaxRatio,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  Gia_Man_t *pWin_00;
  Gia_Man_t *pWinNew;
  Gia_Man_t *pWin;
  Gia_Man_t *pNew;
  Vec_Int_t *vOuts;
  int fVerbose_local;
  int nRelaxRatio_local;
  int nCutNum_local;
  int nTimeWindow_local;
  int LevelMax_local;
  Gia_Man_t *p_local;
  
  if ((LevelMax == 0) != (nTimeWindow == 0)) {
    p_00 = Gia_ManFindLatest(p,LevelMax,nTimeWindow);
    if (fVerbose != 0) {
      uVar1 = Vec_IntSize(p_00);
      printf("Collected %d outputs to extract.\n",(ulong)uVar1);
    }
    iVar2 = Vec_IntSize(p_00);
    if (iVar2 == 0) {
      Vec_IntFree(p_00);
      p_local = Gia_ManDup(p);
    }
    else {
      p_01 = Gia_ManExtractWin(p,p_00,0);
      pWin_00 = Gia_ManPerformSopBalance(p_01,nCutNum,nRelaxRatio,fVerbose);
      Gia_ManStop(p_01);
      p_local = Gia_ManInsertWin(p,p_00,pWin_00);
      Gia_ManStop(pWin_00);
      Vec_IntFree(p_00);
    }
    return p_local;
  }
  __assert_fail("!LevelMax != !nTimeWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalMap.c"
                ,0x10d,
                "Gia_Man_t *Gia_ManPerformSopBalanceWin(Gia_Man_t *, int, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformSopBalanceWin( Gia_Man_t * p, int LevelMax, int nTimeWindow, int nCutNum, int nRelaxRatio, int fVerbose )
{
    Vec_Int_t * vOuts;
    Gia_Man_t * pNew, * pWin, * pWinNew;
    assert( !LevelMax != !nTimeWindow );
    vOuts = Gia_ManFindLatest( p, LevelMax, nTimeWindow );
    if ( fVerbose )
        printf( "Collected %d outputs to extract.\n", Vec_IntSize(vOuts) );
    if ( Vec_IntSize(vOuts) == 0 )
    {
        Vec_IntFree( vOuts );
        return Gia_ManDup( p );
    }
    pWin = Gia_ManExtractWin( p, vOuts, 0 );
    pWinNew = Gia_ManPerformSopBalance( pWin, nCutNum, nRelaxRatio, fVerbose );
    Gia_ManStop( pWin );
    pNew = Gia_ManInsertWin( p, vOuts, pWinNew );
    Gia_ManStop( pWinNew );
    Vec_IntFree( vOuts );
    return pNew;
}